

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

wl_buffer * createShmBuffer(GLFWimage *image)

{
  byte bVar1;
  int iVar2;
  uint size;
  int __fd;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 *__addr;
  wl_shm_pool *wl_shm_pool;
  byte *pbVar6;
  wl_buffer *buffer;
  uint alpha;
  int i;
  uchar *target;
  uchar *source;
  wl_shm_pool *pool;
  void *data;
  int fd;
  int length;
  int stride;
  GLFWimage *image_local;
  
  iVar2 = image->width;
  size = image->width * image->height * 4;
  __fd = createAnonymousFile((long)(int)size);
  if (__fd < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    _glfwInputError(0x10008,"Wayland: Failed to create buffer file of size %d: %s",(ulong)size,
                    pcVar5);
    image_local = (GLFWimage *)0x0;
  }
  else {
    __addr = (undefined1 *)mmap((void *)0x0,(long)(int)size,3,1,__fd,0);
    if (__addr == (undefined1 *)0xffffffffffffffff) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      _glfwInputError(0x10008,"Wayland: Failed to map file: %s",pcVar5);
      close(__fd);
      image_local = (GLFWimage *)0x0;
    }
    else {
      wl_shm_pool = wl_shm_create_pool(_glfw.wl.shm,__fd,size);
      close(__fd);
      target = image->pixels;
      _alpha = __addr;
      for (buffer._4_4_ = 0; buffer._4_4_ < image->width * image->height;
          buffer._4_4_ = buffer._4_4_ + 1) {
        bVar1 = target[3];
        uVar3 = (uint)bVar1;
        *_alpha = (char)((ulong)(target[2] * uVar3) / 0xff);
        _alpha[1] = (char)((ulong)(target[1] * uVar3) / 0xff);
        pbVar6 = _alpha + 3;
        _alpha[2] = (char)((ulong)(*target * uVar3) / 0xff);
        _alpha = _alpha + 4;
        *pbVar6 = bVar1;
        target = target + 4;
      }
      image_local = (GLFWimage *)
                    wl_shm_pool_create_buffer(wl_shm_pool,0,image->width,image->height,iVar2 << 2,0)
      ;
      munmap(__addr,(long)(int)size);
      wl_shm_pool_destroy(wl_shm_pool);
    }
  }
  return (wl_buffer *)image_local;
}

Assistant:

static struct wl_buffer* createShmBuffer(const GLFWimage* image)
{
    const int stride = image->width * 4;
    const int length = image->width * image->height * 4;

    const int fd = createAnonymousFile(length);
    if (fd < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create buffer file of size %d: %s",
                        length, strerror(errno));
        return NULL;
    }

    void* data = mmap(NULL, length, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if (data == MAP_FAILED)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to map file: %s", strerror(errno));
        close(fd);
        return NULL;
    }

    struct wl_shm_pool* pool = wl_shm_create_pool(_glfw.wl.shm, fd, length);

    close(fd);

    unsigned char* source = (unsigned char*) image->pixels;
    unsigned char* target = data;
    for (int i = 0;  i < image->width * image->height;  i++, source += 4)
    {
        unsigned int alpha = source[3];

        *target++ = (unsigned char) ((source[2] * alpha) / 255);
        *target++ = (unsigned char) ((source[1] * alpha) / 255);
        *target++ = (unsigned char) ((source[0] * alpha) / 255);
        *target++ = (unsigned char) alpha;
    }

    struct wl_buffer* buffer =
        wl_shm_pool_create_buffer(pool, 0,
                                  image->width,
                                  image->height,
                                  stride, WL_SHM_FORMAT_ARGB8888);
    munmap(data, length);
    wl_shm_pool_destroy(pool);

    return buffer;
}